

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::EliminateDeadMembersPass::MarkMembersAsLiveForCopyMemory
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  uint32_t uVar1;
  DefUseManager *pDVar2;
  Instruction *pIVar3;
  uint32_t type_id;
  Instruction *pointer_type_inst;
  uint32_t pointer_type_id;
  Instruction *target_inst;
  uint32_t target_id;
  Instruction *inst_local;
  EliminateDeadMembersPass *this_local;
  
  uVar1 = opt::Instruction::GetSingleWordInOperand(inst,0);
  pDVar2 = Pass::get_def_use_mgr((Pass *)this);
  pIVar3 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
  uVar1 = opt::Instruction::type_id(pIVar3);
  pDVar2 = Pass::get_def_use_mgr((Pass *)this);
  pIVar3 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
  uVar1 = opt::Instruction::GetSingleWordInOperand(pIVar3,1);
  MarkTypeAsFullyUsed(this,uVar1);
  return;
}

Assistant:

void EliminateDeadMembersPass::MarkMembersAsLiveForCopyMemory(
    const Instruction* inst) {
  uint32_t target_id = inst->GetSingleWordInOperand(0);
  Instruction* target_inst = get_def_use_mgr()->GetDef(target_id);
  uint32_t pointer_type_id = target_inst->type_id();
  Instruction* pointer_type_inst = get_def_use_mgr()->GetDef(pointer_type_id);
  uint32_t type_id = pointer_type_inst->GetSingleWordInOperand(1);
  MarkTypeAsFullyUsed(type_id);
}